

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_LookupTable(LookupTableForm3 LookupTable)

{
  uint8_t uVar1;
  bool bVar2;
  byte *pbVar3;
  reference pvVar4;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lookupTable;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t *in_stack_fffffffffffffe98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined6 in_stack_fffffffffffffea0;
  uint8_t in_stack_fffffffffffffea6;
  uint8_t in_stack_fffffffffffffea7;
  uint32_t in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  byte bVar5;
  Image *in_stack_fffffffffffffeb0;
  Image *image;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  value_type vVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  Image *in_stack_ffffffffffffff00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  undefined1 local_d8 [47];
  undefined1 local_a9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined1 local_48 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffeb0,
             CONCAT13(in_stack_fffffffffffffeaf,
                      CONCAT12(in_stack_fffffffffffffeae,
                               CONCAT11(in_stack_fffffffffffffead,in_stack_fffffffffffffeac))),
             in_stack_fffffffffffffea8,in_stack_fffffffffffffea7,in_stack_fffffffffffffea6);
  Test_Helper::uniformImage
            (CONCAT13(in_stack_fffffffffffffeaf,
                      CONCAT12(in_stack_fffffffffffffeae,
                               CONCAT11(in_stack_fffffffffffffead,in_stack_fffffffffffffeac))),
             in_stack_fffffffffffffea8,
             (Image *)CONCAT17(in_stack_fffffffffffffea7,
                               CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1da195);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffeb0,
             (uint32_t *)
             CONCAT17(in_stack_fffffffffffffeaf,
                      CONCAT16(in_stack_fffffffffffffeae,
                               CONCAT15(in_stack_fffffffffffffead,
                                        CONCAT14(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                )))),
             (uint32_t *)
             CONCAT17(in_stack_fffffffffffffea7,
                      CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
             in_stack_fffffffffffffe98,(uint32_t *)0x1da1c2);
  Unit_Test::fillImage
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
             (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_a9 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1da212);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffec0,CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)
             ,(value_type_conflict *)in_stack_fffffffffffffeb0,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffffeaf,
                      CONCAT16(in_stack_fffffffffffffeae,
                               CONCAT15(in_stack_fffffffffffffead,
                                        CONCAT14(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                )))));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1da240);
  uVar1 = Unit_Test::intensityValue();
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_a8,(ulong)*pbVar3);
  *pvVar4 = uVar1;
  uVar1 = Unit_Test::intensityValue();
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  this = &local_a8;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (this,(ulong)*pbVar3);
  *pvVar4 = uVar1;
  (*local_8)(local_d8,local_48,local_80,local_84,local_88,local_8c);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1da302);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffec0,CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)
             ,(allocator_type *)in_stack_fffffffffffffeb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1da322);
  image = (Image *)0x0;
  this_00 = &local_20;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_a8,(ulong)*pbVar3);
  vVar6 = *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_f0,(size_type)image);
  *pvVar4 = vVar6;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_a8,(ulong)*pbVar3);
  vVar6 = *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_f0,1);
  *pvVar4 = vVar6;
  bVar2 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_fffffffffffffea7,
                                       CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)
                                      ),(uint32_t)((ulong)this >> 0x20),(uint32_t)this);
  bVar5 = false;
  if (bVar2) {
    bVar5 = Unit_Test::verifyImage
                      (image,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (ulong)CONCAT16(in_stack_fffffffffffffeae,
                                             CONCAT15(in_stack_fffffffffffffead,
                                                      CONCAT14(in_stack_fffffffffffffeac,
                                                               in_stack_fffffffffffffea8))),
                       (bool)in_stack_fffffffffffffea7);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1da42a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1da444);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  return (bool)(bVar5 & 1);
}

Assistant:

bool form3_LookupTable(LookupTableForm3 LookupTable)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input = uniformImage();

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        fillImage( input, roiX, roiY, roiWidth, roiHeight, intensity );

        std::vector < uint8_t > lookupTable( 256, 0 );

        lookupTable[intensity[0]] = intensityValue();
        lookupTable[intensity[1]] = intensityValue();

        const PenguinV_Image::Image output = LookupTable( input, roiX, roiY, roiWidth, roiHeight, lookupTable );

        std::vector < uint8_t > normalized( 2 );

        normalized[0] = lookupTable[intensity[0]];
        normalized[1] = lookupTable[intensity[1]];

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, normalized );
    }